

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dense.cpp
# Opt level: O2

MatrixXd * __thiscall Dense::forward(MatrixXd *__return_storage_ptr__,Dense *this,MatrixXd *input)

{
  MatrixXd *other;
  bool bVar1;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_80;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>
  local_70;
  MatrixXd *local_40;
  Index local_38;
  undefined8 local_30;
  
  local_80 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)input,
                        (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->weigths);
  local_40 = &this->biases;
  local_38 = (input->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_rows;
  local_30 = 1;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
  ::operator+(&local_70,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
               *)&local_80,
              (MatrixBase<Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_> *)
              &local_40);
  other = &this->activation;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Replicate<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1>const>>
            (other,&local_70);
  bVar1 = std::operator==(&this->type,"tanh");
  if (bVar1) {
    local_70.m_lhs.m_rhs = (RhsNested)activation_functions::tanh_transfer;
  }
  else {
    bVar1 = std::operator==(&this->type,"sigmoid");
    if (!bVar1) goto LAB_00118320;
    local_70.m_lhs.m_rhs = (RhsNested)activation_functions::sigmoid_transfer;
  }
  local_70.m_lhs.m_lhs = other;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseUnaryOp<double(*)(double),Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            (other,(CwiseUnaryOp<double_(*)(double),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)&local_70);
LAB_00118320:
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (&this->last_input,input);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,
             (DenseStorage<double,__1,__1,__1,_0> *)other);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd Dense::forward(Eigen::MatrixXd input) {
    activation = input*weigths + biases.replicate(input.rows(),1);;
    if(type == "tanh") {
        activation = activation.unaryExpr(&activation_functions::tanh_transfer);
    }
    else if(type == "sigmoid") {
        activation = activation.unaryExpr(&activation_functions::sigmoid_transfer);
    }
    last_input = input;
    return activation;
}